

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O2

void __thiscall deqp::egl::MultiThreadedTest::~MultiThreadedTest(MultiThreadedTest *this)

{
  pointer ppTVar1;
  pointer ppTVar2;
  int threadNdx;
  long lVar3;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultiThreadedTest_01e09950;
  lVar3 = 0;
  while( true ) {
    ppTVar1 = (this->m_threads).
              super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppTVar2 = (this->m_threads).
              super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)ppTVar2 - (long)ppTVar1) >> 3) <= lVar3) break;
    if (ppTVar1[lVar3] != (TestThread *)0x0) {
      (*(ppTVar1[lVar3]->super_Thread)._vptr_Thread[1])();
    }
    lVar3 = lVar3 + 1;
  }
  if (ppTVar2 != ppTVar1) {
    (this->m_threads).
    super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppTVar1;
  }
  de::Semaphore::~Semaphore(&this->m_barrierSemaphore2);
  de::Semaphore::~Semaphore(&this->m_barrierSemaphore1);
  std::_Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>::
  ~_Vector_base(&(this->m_threads).
                 super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
               );
  egl::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

MultiThreadedTest::~MultiThreadedTest (void)
{
	for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
		delete m_threads[threadNdx];
	m_threads.clear();
}